

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re_search.c
# Opt level: O2

int re_backsrch(void)

{
  mgwin *pmVar1;
  regoff_t rVar2;
  int iVar3;
  int iVar4;
  regoff_t unaff_EBX;
  char *__string;
  line *plVar5;
  int iVar6;
  int iVar7;
  
  plVar5 = curwp->w_dotp;
  iVar4 = curwp->w_dotline;
  if (curwp->w_doto < 1) goto LAB_00114259;
  iVar6 = curwp->w_doto + -1;
  while( true ) {
    if (plVar5 == curbp->b_headp) {
      return 0;
    }
    regex_match[0].rm_so = 0;
    rVar2 = regex_match[0].rm_so;
    iVar7 = -1;
    while( true ) {
      regex_match[0].rm_so = rVar2;
      regex_match[0].rm_eo = plVar5->l_used;
      __string = plVar5->l_text;
      if (__string == (char *)0x0) {
        __string = "";
      }
      iVar3 = regexec((regex_t *)&regex_buff,__string,10,(regmatch_t *)regex_match,4);
      pmVar1 = curwp;
      if ((iVar3 != 0) || (iVar6 < regex_match[0].rm_so)) break;
      rVar2 = regex_match[0].rm_so + 1;
      unaff_EBX = regex_match[0].rm_eo;
      iVar7 = regex_match[0].rm_so;
    }
    if (iVar7 != -1) break;
LAB_00114259:
    plVar5 = plVar5->l_bp;
    iVar4 = iVar4 + -1;
    iVar6 = plVar5->l_used;
  }
  regex_match[0].rm_so = iVar7;
  regex_match[0].rm_eo = unaff_EBX;
  curwp->w_doto = iVar7;
  pmVar1->w_dotp = plVar5;
  pmVar1->w_dotline = iVar4;
  pmVar1->w_rflag = pmVar1->w_rflag | 2;
  return 1;
}

Assistant:

static int
re_backsrch(void)
{
	struct line		*clp;
	int		 tbo, tdotline;
	regmatch_t	 lastmatch;

	clp = curwp->w_dotp;
	tbo = curwp->w_doto;
	tdotline = curwp->w_dotline;

	/* Start search one position to the left of dot */
	tbo = tbo - 1;
	if (tbo < 0) {
		/* must move up one line */
		clp = lback(clp);
		tdotline--;
		tbo = llength(clp);
	}

	/*
	 * Note this loop does not process the last line, but this editor
	 * always makes the last line empty so this is good.
	 */
	while (clp != (curbp->b_headp)) {
		regex_match[0].rm_so = 0;
		regex_match[0].rm_eo = llength(clp);
		lastmatch.rm_so = -1;
		/*
		 * Keep searching until we don't match any longer.  Assumes a
		 * non-match does not modify the regex_match array.  We have to
		 * do this character-by-character after the first match since
		 * POSIX regexps don't give you a way to do reverse matches.
		 */
		while (!regexec(&regex_buff, ltext(clp) ? ltext(clp) : "",
		    RE_NMATCH, regex_match, REG_STARTEND) &&
		    regex_match[0].rm_so <= tbo) {
			memcpy(&lastmatch, &regex_match[0], sizeof(regmatch_t));
			regex_match[0].rm_so++;
			regex_match[0].rm_eo = llength(clp);
		}
		if (lastmatch.rm_so == -1) {
			clp = lback(clp);
			tdotline--;
			tbo = llength(clp);
		} else {
			memcpy(&regex_match[0], &lastmatch, sizeof(regmatch_t));
			curwp->w_doto = regex_match[0].rm_so;
			curwp->w_dotp = clp;
			curwp->w_dotline = tdotline;
			curwp->w_rflag |= WFMOVE;
			return (TRUE);
		}
	}
	return (FALSE);
}